

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O3

void slang::ast::GenerateBlockSymbol::fromSyntax
               (Compilation *compilation,CaseGenerateSyntax *syntax,ASTContext *context,
               uint32_t constructIndex,bool isUninstantiated,
               SmallVectorBase<slang::ast::GenerateBlockSymbol_*> *results)

{
  pointer ppCVar1;
  size_t sVar2;
  CaseItemSyntax *pCVar3;
  Expression *expr;
  Expression *expr_00;
  span<const_slang::syntax::ExpressionSyntax_*const,_18446744073709551615UL> expressions_00;
  SourceRange sourceRange;
  SourceRange range;
  bool bVar4;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar5;
  bool bVar6;
  bool bVar7;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar8;
  Diagnostic *pDVar9;
  bool bVar10;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes;
  pointer ppCVar11;
  SyntaxNode **ppSVar12;
  ulong uVar13;
  SyntaxNode *syntax_00;
  long lVar14;
  StandardCaseItemSyntax *sci;
  SmallVector<const_slang::ast::Expression_*,_5UL> bound;
  ConstantValue condVal;
  SmallVector<const_slang::syntax::ExpressionSyntax_*,_5UL> expressions;
  ConstantValue val;
  SmallVectorBase<const_slang::ast::Expression_*> *in_stack_fffffffffffffe58;
  Type *local_190;
  SourceLocation local_148;
  SourceLocation local_140;
  SourceLocation local_138;
  SourceLocation local_130;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  SyntaxNode local_e8;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_c0;
  ExpressionSyntax *local_98;
  pointer local_90;
  undefined8 local_88;
  ExpressionSyntax local_80;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_58;
  
  local_98 = &local_80;
  local_90 = (pointer)0x0;
  local_88 = 5;
  sVar2 = (syntax->items).super_span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>.
          _M_extent._M_extent_value;
  if (sVar2 == 0) {
    syntax_00 = (SyntaxNode *)0x0;
  }
  else {
    ppCVar11 = (syntax->items).super_span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>.
               _M_ptr;
    ppCVar1 = ppCVar11 + sVar2;
    syntax_00 = (SyntaxNode *)0x0;
    do {
      pCVar3 = *ppCVar11;
      if ((pCVar3->super_SyntaxNode).kind == StandardCaseItem) {
        uVar13 = *(long *)&pCVar3[3].super_SyntaxNode + 1;
        if (1 < uVar13) {
          uVar13 = uVar13 >> 1;
          lVar14 = 0;
          do {
            ppSVar8 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                                ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                  *)((long)&(pCVar3[2].super_SyntaxNode.previewNode)->kind + lVar14)
                                );
            local_100 = *ppSVar8;
            SmallVectorBase<slang::syntax::ExpressionSyntax_const*>::
            emplace_back<slang::syntax::ExpressionSyntax_const*const&>
                      ((SmallVectorBase<slang::syntax::ExpressionSyntax_const*> *)&local_98,
                       (ExpressionSyntax **)&local_100);
            lVar14 = lVar14 + 0x30;
            uVar13 = uVar13 - 1;
          } while (uVar13 != 0);
        }
      }
      else {
        syntax_00 = pCVar3[2].super_SyntaxNode.parent;
      }
      ppCVar11 = ppCVar11 + 1;
    } while (ppCVar11 != ppCVar1);
  }
  local_100 = &local_e8;
  local_f8 = 0;
  local_f0 = 5;
  expressions_00._M_extent._M_extent_value = (size_t)&local_100;
  expressions_00._M_ptr = local_90;
  bVar6 = Expression::bindMembershipExpressions
                    ((Expression *)context,(ASTContext *)0x73,Unknown,false,true,true,
                     SUB81((syntax->condition).ptr,0),local_98,expressions_00,
                     in_stack_fffffffffffffe58);
  pSVar5 = local_100;
  if (!bVar6) goto LAB_001d54bf;
  expr = *(Expression **)&local_100->kind;
  ASTContext::eval((ConstantValue *)&local_c0,context,expr,(bitmask<slang::ast::EvalFlags>)0x0);
  if (local_c0._M_index == '\0') {
    if (expr->kind == TypeReference) {
      local_190 = *(Type **)(expr + 1);
      goto LAB_001d518e;
    }
  }
  else {
    local_190 = (Type *)0x0;
LAB_001d518e:
    sVar2 = (syntax->items).super_span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>.
            _M_extent._M_extent_value;
    if (sVar2 == 0) {
      if (syntax_00 != (SyntaxNode *)0x0) {
        bVar6 = false;
        goto LAB_001d544c;
      }
LAB_001d5486:
      pDVar9 = ASTContext::addDiag(context,(DiagCode)0xe90006,expr->sourceRange);
      Diagnostic::operator<<(pDVar9,(ConstantValue *)&local_c0);
    }
    else {
      ppSVar12 = &pSVar5->parent;
      ppCVar11 = (syntax->items).super_span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>
                 ._M_ptr;
      ppCVar1 = ppCVar11 + sVar2;
      attributes = &(syntax->super_MemberSyntax).attributes;
      bVar6 = false;
      bVar10 = false;
      local_130 = (SourceLocation)0x0;
      local_138 = (SourceLocation)0x0;
      do {
        pCVar3 = *ppCVar11;
        if ((pCVar3->super_SyntaxNode).kind == StandardCaseItem) {
          if (1 < *(long *)&pCVar3[3].super_SyntaxNode + 1U) {
            bVar4 = false;
            uVar13 = 0;
            local_140 = (SourceLocation)0x0;
            local_148 = (SourceLocation)0x0;
            do {
              expr_00 = (Expression *)*ppSVar12;
              ASTContext::eval((ConstantValue *)&local_58,context,expr_00,
                               (bitmask<slang::ast::EvalFlags>)0x0);
              if (local_58._M_index == '\0') {
                if (local_190 != (Type *)0x0) {
                  bVar7 = false;
                  goto LAB_001d5291;
                }
              }
              else {
                bVar7 = slang::operator==((ConstantValue *)&local_58,(ConstantValue *)&local_c0);
                if ((local_58._M_index == '\0') && (local_190 != (Type *)0x0)) {
LAB_001d5291:
                  if (expr_00->kind == TypeReference) {
                    bVar7 = Type::isMatching(*(Type **)(expr_00 + 1),local_190);
                  }
                }
                if ((!bVar4) && (bVar7 != false)) {
                  local_148 = (expr_00->sourceRange).startLoc;
                  local_140 = (expr_00->sourceRange).endLoc;
                  bVar4 = true;
                }
              }
              ppSVar12 = ppSVar12 + 1;
              std::__detail::__variant::
              _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              ::~_Variant_storage(&local_58);
              uVar13 = uVar13 + 1;
            } while (uVar13 < *(long *)&pCVar3[3].super_SyntaxNode + 1U >> 1);
            if (bVar4) {
              if (!bVar6) {
                bVar6 = true;
                createCondGenBlock(compilation,*(SyntaxNode **)&pCVar3[4].super_SyntaxNode,context,
                                   constructIndex,isUninstantiated,attributes,results);
                local_138 = local_148;
                local_130 = local_140;
                goto LAB_001d53a8;
              }
              bVar4 = !bVar10;
              bVar10 = true;
              if (bVar4) {
                sourceRange.endLoc = local_140;
                sourceRange.startLoc = local_148;
                pDVar9 = ASTContext::addDiag(context,(DiagCode)0xe80006,sourceRange);
                Diagnostic::operator<<(pDVar9,(ConstantValue *)&local_c0);
                range.endLoc = local_130;
                range.startLoc = local_138;
                Diagnostic::addNote(pDVar9,(DiagCode)0xb0001,range);
              }
            }
          }
          createCondGenBlock(compilation,*(SyntaxNode **)&pCVar3[4].super_SyntaxNode,context,
                             constructIndex,true,attributes,results);
        }
LAB_001d53a8:
        ppCVar11 = ppCVar11 + 1;
      } while (ppCVar11 != ppCVar1);
      if (syntax_00 == (SyntaxNode *)0x0) {
        if (bVar6 == false) goto LAB_001d5486;
      }
      else {
LAB_001d544c:
        createCondGenBlock(compilation,syntax_00,context,constructIndex,
                           (bool)(isUninstantiated | bVar6),&(syntax->super_MemberSyntax).attributes
                           ,results);
      }
    }
  }
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ::~_Variant_storage(&local_c0);
LAB_001d54bf:
  if (local_100 != &local_e8) {
    operator_delete(local_100);
  }
  if (local_98 != &local_80) {
    operator_delete(local_98);
  }
  return;
}

Assistant:

void GenerateBlockSymbol::fromSyntax(Compilation& compilation, const CaseGenerateSyntax& syntax,
                                     const ASTContext& context, uint32_t constructIndex,
                                     bool isUninstantiated,
                                     SmallVectorBase<GenerateBlockSymbol*>& results) {

    SmallVector<const ExpressionSyntax*> expressions;
    const SyntaxNode* defBlock = nullptr;
    for (auto item : syntax.items) {
        switch (item->kind) {
            case SyntaxKind::StandardCaseItem: {
                auto& sci = item->as<StandardCaseItemSyntax>();
                for (auto es : sci.expressions)
                    expressions.push_back(es);
                break;
            }
            case SyntaxKind::DefaultCaseItem:
                // The parser already errored for duplicate defaults,
                // so just ignore if it happens here.
                defBlock = item->as<DefaultCaseItemSyntax>().clause;
                break;
            default:
                SLANG_UNREACHABLE;
        }
    }

    SmallVector<const Expression*> bound;
    if (!Expression::bindMembershipExpressions(
            context, TokenKind::CaseKeyword, /* requireIntegral */ false,
            /* unwrapUnpacked */ false, /* allowTypeReferences */ true, /* allowValueRange */ true,
            *syntax.condition, expressions, bound)) {
        return;
    }

    auto boundIt = bound.begin();
    auto condExpr = *boundIt++;

    const Type* condType = nullptr;
    ConstantValue condVal = context.eval(*condExpr);
    if (!condVal) {
        if (condExpr->kind == ExpressionKind::TypeReference)
            condType = &condExpr->as<TypeReferenceExpression>().targetType;
        else
            return;
    }

    SourceRange matchRange;
    bool found = false;
    bool warned = false;

    for (auto item : syntax.items) {
        if (item->kind != SyntaxKind::StandardCaseItem)
            continue;

        // Check each case expression to see if it matches the condition value.
        bool currentFound = false;
        SourceRange currentMatchRange;
        auto& sci = item->as<StandardCaseItemSyntax>();
        for (size_t i = 0; i < sci.expressions.size(); i++) {
            // Have to keep incrementing the iterator here so that we stay in sync.
            auto expr = *boundIt++;
            ConstantValue val = context.eval(*expr);

            bool match = val && val == condVal;
            if (!val && condType && expr->kind == ExpressionKind::TypeReference)
                match = expr->as<TypeReferenceExpression>().targetType.isMatching(*condType);

            if (!currentFound && match) {
                currentFound = true;
                currentMatchRange = expr->sourceRange;
            }
        }

        if (currentFound && !found) {
            // This is the first match for this entire case generate.
            found = true;
            matchRange = currentMatchRange;
            createCondGenBlock(compilation, *sci.clause, context, constructIndex, isUninstantiated,
                               syntax.attributes, results);
        }
        else {
            // If we previously found a block, this block also matched, which we should warn about.
            if (currentFound && !warned) {
                auto& diag = context.addDiag(diag::CaseGenerateDup, currentMatchRange);
                diag << condVal;
                diag.addNote(diag::NotePreviousMatch, matchRange);
                warned = true;
            }

            // This block is not taken, so create it as uninstantiated.
            createCondGenBlock(compilation, *sci.clause, context, constructIndex, true,
                               syntax.attributes, results);
        }
    }

    if (defBlock) {
        // Only instantiated if no other blocks were instantiated.
        createCondGenBlock(compilation, *defBlock, context, constructIndex,
                           isUninstantiated || found, syntax.attributes, results);
    }
    else if (!found) {
        auto& diag = context.addDiag(diag::CaseGenerateNoBlock, condExpr->sourceRange);
        diag << condVal;
    }
}